

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRule>::reallocate
          (QMovableArrayOps<QMimeMagicRule> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QMimeMagicRule>_*,_QMimeMagicRule_*> pVar1;
  
  pVar1 = QTypedArrayData<QMimeMagicRule>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QMimeMagicRule>).
                     super_QArrayDataPointer<QMimeMagicRule>.d,
                     (this->super_QGenericArrayOps<QMimeMagicRule>).
                     super_QArrayDataPointer<QMimeMagicRule>.ptr,alloc,option);
  if (pVar1.second != (QMimeMagicRule *)0x0) {
    (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.d =
         pVar1.first;
    (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.ptr =
         pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }